

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O3

bool __thiscall PhyloTree::removeSplit(PhyloTree *this,Bipartition *e)

{
  bool bVar1;
  pointer pPVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  pPVar2 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish == pPVar2) {
    bVar1 = false;
  }
  else {
    uVar3 = 1;
    lVar4 = 0;
    do {
      bVar1 = PhyloTreeEdge::sameBipartition
                        ((PhyloTreeEdge *)
                         ((long)&(pPVar2->super_Bipartition)._vptr_Bipartition + lVar4),e);
      if (bVar1) {
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_erase
                  (&this->edges,
                   (PhyloTreeEdge *)
                   ((long)&(((this->edges).
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                             _M_impl.super__Vector_impl_data._M_start)->super_Bipartition).
                           _vptr_Bipartition + lVar4));
      }
      pPVar2 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar3 < (ulong)(((long)(this->edges).
                                     super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 3)
                             * -0x71c71c71c71c71c7);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x48;
    } while (bVar5 && !bVar1);
  }
  return bVar1;
}

Assistant:

bool PhyloTree::removeSplit(const Bipartition &e) {
    bool removed = false;
    size_t i = 0;
    while (i < edges.size() && !removed) {
        if (edges[i].sameBipartition(e)) {
            Tools::vector_remove_element_at_index(edges, i);
            removed = true;
        }
        i++;
    }
    return removed;
}